

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O0

void __thiscall mau::DeliveryCommonData::DeliveryCommonData(DeliveryCommonData *this)

{
  Channel *in_RDI;
  undefined8 in_stack_ffffffffffffffd0;
  BufferAllocator *this_00;
  char *in_stack_ffffffffffffffd8;
  Channel *pCVar1;
  
  pCVar1 = in_RDI;
  logger::Channel::Channel
            (in_RDI,in_stack_ffffffffffffffd8,(Level)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  this_00 = (BufferAllocator *)(pCVar1 + 1);
  std::shared_ptr<asio::io_context>::shared_ptr((shared_ptr<asio::io_context> *)0x26805b);
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>,std::default_delete<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>>>
  ::
  unique_ptr<std::default_delete<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>>,void>
            ((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
              *)this_00);
  BufferAllocator::BufferAllocator(this_00);
  std::atomic<MauResult_t>::atomic((atomic<MauResult_t> *)&in_RDI[6].field_0x50,Mau_Success);
  LockedValue<MauChannelConfig_t>::LockedValue((LockedValue<MauChannelConfig_t> *)this_00);
  MauProxyConfig_t::MauProxyConfig_t((MauProxyConfig_t *)&in_RDI[8].PrefixLock);
  return;
}

Assistant:

DeliveryCommonData::DeliveryCommonData()
    : Logger("MauProxy", MinimumLogLevel)
{
}